

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

bool __thiscall QThreadPool::tryStart(QThreadPool *this,QRunnable *runnable)

{
  QThreadPoolPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (runnable == (QRunnable *)0x0) {
    bVar1 = false;
  }
  else {
    this_00 = (QThreadPoolPrivate *)(this->super_QObject).d_ptr.d;
    local_28._0_8_ = &this_00->mutex;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBasicMutex::lock((QBasicMutex *)local_28._0_8_);
    local_28[8] = true;
    bVar1 = QThreadPoolPrivate::tryStart(this_00,runnable);
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QThreadPool::tryStart(QRunnable *runnable)
{
    if (!runnable)
        return false;

    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);
    if (d->tryStart(runnable))
        return true;

    return false;
}